

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Mocap.cpp
# Opt level: O2

void __thiscall chrono::ChFunction_Mocap::Set_samples(ChFunction_Mocap *this,int m_samples)

{
  ulong size;
  
  size = (ulong)(uint)m_samples;
  if (m_samples < 3) {
    size = 2;
  }
  this->samples = (int)size;
  this->timetot = (double)(int)size / this->samp_freq;
  Eigen::PlainObjectBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::resize
            (&(this->array_y).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>,size);
  Eigen::PlainObjectBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::resize
            (&(this->array_y_dt).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>,
             (long)this->samples);
  Eigen::PlainObjectBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::resize
            (&(this->array_y_dtdt).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>,
             (long)this->samples);
  return;
}

Assistant:

void ChFunction_Mocap::Set_samples(int m_samples) {
    samples = m_samples;

    if (samples < 2)
        samples = 2;

    timetot = ((double)samples / samp_freq);

    array_y.resize(samples);
    array_y_dt.resize(samples);
    array_y_dtdt.resize(samples);
}